

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# engine.cpp
# Opt level: O1

void __thiscall CEngine::StartLogging(CEngine *this,IOHANDLE DataLogSent,IOHANDLE DataLogRecv)

{
  char *pcVar1;
  
  if (DataLogSent == (IOHANDLE)0x0) {
    pcVar1 = "failed to start logging network sent packages";
  }
  else {
    this->m_DataLogSent = DataLogSent;
    pcVar1 = "logging network sent packages";
  }
  dbg_msg("engine",pcVar1);
  if (DataLogRecv == (IOHANDLE)0x0) {
    pcVar1 = "failed to start logging network recv packages";
  }
  else {
    this->m_DataLogRecv = DataLogRecv;
    pcVar1 = "logging network recv packages";
  }
  dbg_msg("engine",pcVar1);
  this->m_Logging = true;
  return;
}

Assistant:

void StartLogging(IOHANDLE DataLogSent, IOHANDLE DataLogRecv)
	{
		if(DataLogSent)
		{
			m_DataLogSent = DataLogSent;
			dbg_msg("engine", "logging network sent packages");
		}
		else
			dbg_msg("engine", "failed to start logging network sent packages");

		if(DataLogRecv)
		{
			m_DataLogRecv = DataLogRecv;
			dbg_msg("engine", "logging network recv packages");
		}
		else
			dbg_msg("engine", "failed to start logging network recv packages");

		m_Logging = true;
	}